

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O3

void linenoiseEditDelete(linenoiseState *l)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  
  uVar1 = l->len;
  if ((uVar1 != 0) && (l->pos < uVar1)) {
    iVar2 = (*(code *)nextCharLen)(l->buf,uVar1,l->pos,0);
    lVar4 = (long)iVar2;
    memmove(l->buf + l->pos,l->buf + l->pos + lVar4,l->len - (l->pos + lVar4));
    sVar3 = l->len - lVar4;
    l->len = sVar3;
    l->buf[sVar3] = '\0';
    iVar2 = getColumns(0,1);
    l->cols = (long)iVar2;
    refreshLineWithFlags(l,3);
    return;
  }
  return;
}

Assistant:

void linenoiseEditDelete(struct linenoiseState *l) {
    if (l->len > 0 && l->pos < l->len) {
        int chlen = nextCharLen(l->buf,l->len,l->pos,NULL);
        memmove(l->buf+l->pos,l->buf+l->pos+chlen,l->len-l->pos-chlen);
        l->len-=chlen;
        l->buf[l->len] = '\0';
        refreshLine(l);
    }
}